

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

UntypedActionResultHolderBase * __thiscall
testing::internal::UntypedFunctionMockerBase::UntypedInvokeWith
          (UntypedFunctionMockerBase *this,void *untyped_args)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  CallReaction reaction;
  undefined4 extraout_var;
  char *pcVar6;
  size_t sVar7;
  UntypedActionResultHolderBase *pUVar8;
  undefined4 extraout_var_01;
  FailureReporterInterface *pFVar9;
  undefined8 *puVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  LogSeverity severity;
  ulong uVar11;
  bool is_excessive;
  void *untyped_action;
  stringstream ss;
  stringstream why;
  stringstream loc;
  char local_531;
  string local_530;
  long local_510;
  ulong *local_508;
  long local_500;
  ulong local_4f8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4e8;
  long local_4e0;
  ulong local_4d8 [2];
  long *local_4c8 [2];
  long local_4b8 [14];
  ios_base local_448 [264];
  string local_340 [4];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  ExpectationBase *this_00;
  undefined4 extraout_var_00;
  
  if ((this->untyped_expectations_).
      super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->untyped_expectations_).
      super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_531 = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)local_4c8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_510 = 0;
    iVar5 = (*this->_vptr_UntypedFunctionMockerBase[6])
                      (this,untyped_args,&local_510,&local_531,(ostream *)local_4b8,
                       &local_340[0].field_2);
    this_00 = (ExpectationBase *)CONCAT44(extraout_var,iVar5);
    if (((this_00 == (ExpectationBase *)0x0) || (local_531 != '\0')) ||
       (bVar4 = LogIsVisible(kInfo), bVar4)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b8,"    Function call: ",0x13);
      pcVar6 = Name(this);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)(ostream *)local_4b8 + (int)*(undefined8 *)(local_4b8[0] + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,pcVar6,sVar7);
      }
      (*this->_vptr_UntypedFunctionMockerBase[7])(this,untyped_args,(ostream *)local_4b8);
      if ((this_00 != (ExpectationBase *)0x0) && (local_531 == '\0')) {
        ExpectationBase::DescribeLocationTo(this_00,local_1a8);
      }
      if (local_510 == 0) {
        std::__cxx11::stringbuf::str();
        iVar5 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args,&local_530);
        pUVar8 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_01,iVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p);
        }
      }
      else {
        iVar5 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,local_510,untyped_args);
        pUVar8 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_00,iVar5);
      }
      if (pUVar8 != (UntypedActionResultHolderBase *)0x0) {
        (*pUVar8->_vptr_UntypedActionResultHolderBase[2])(pUVar8,(ostream *)local_4b8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"\n",1);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b8,local_530._M_dataplus._M_p,local_530._M_string_length);
      paVar2 = &local_530.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != paVar2) {
        operator_delete(local_530._M_dataplus._M_p);
      }
      if (this_00 == (ExpectationBase *)0x0) {
        std::__cxx11::stringbuf::str();
        pFVar9 = GetFailureReporter();
        (*pFVar9->_vptr_FailureReporterInterface[2])(pFVar9,0,0,0xffffffff,&local_530);
LAB_00154ed9:
        local_4e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_530._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p == &local_530.field_2) goto LAB_0015514a;
      }
      else {
        if (local_531 == '\x01') {
          pcVar6 = this_00->file_;
          uVar3 = this_00->line_;
          std::__cxx11::stringbuf::str();
          pFVar9 = GetFailureReporter();
          (*pFVar9->_vptr_FailureReporterInterface[2])(pFVar9,0,pcVar6,(ulong)uVar3,&local_530);
          goto LAB_00154ed9;
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringbuf::str();
        uVar11 = 0xf;
        if (local_4e8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8) {
          uVar11 = local_4d8[0];
        }
        if (uVar11 < (ulong)(local_500 + local_4e0)) {
          uVar11 = 0xf;
          if (local_508 != local_4f8) {
            uVar11 = local_4f8[0];
          }
          if (uVar11 < (ulong)(local_500 + local_4e0)) goto LAB_00154f5c;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_508,0,(char *)0x0,(ulong)local_4e8);
        }
        else {
LAB_00154f5c:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_4e8,(ulong)local_508);
        }
        puVar1 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar1) {
          local_530.field_2._M_allocated_capacity = *puVar1;
          local_530.field_2._8_8_ = puVar10[3];
          local_530._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_530.field_2._M_allocated_capacity = *puVar1;
          local_530._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_530._M_string_length = puVar10[1];
        *puVar10 = puVar1;
        puVar10[1] = 0;
        *(undefined1 *)puVar1 = 0;
        Log(kInfo,&local_530,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != paVar2) {
          operator_delete(local_530._M_dataplus._M_p);
        }
        if (local_508 != local_4f8) {
          operator_delete(local_508);
        }
        if (local_4e8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8) goto LAB_0015514a;
      }
      operator_delete(local_4e8);
    }
    else {
      if (local_510 == 0) {
        local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"");
        iVar5 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args,&local_530);
        pUVar8 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_05,iVar5);
        goto LAB_00154ed9;
      }
      iVar5 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,local_510,untyped_args);
      pUVar8 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_04,iVar5);
    }
LAB_0015514a:
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(aiStack_138);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(aiStack_2c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8);
    goto LAB_001551a1;
  }
  MockObject(this);
  reaction = Mock::GetReactionOnUninterestingCalls((void *)0x154d50);
  if (reaction == kDefault) {
    severity = kWarning;
LAB_00154f70:
    bVar4 = LogIsVisible(severity);
    if (!bVar4) {
      local_4c8[0] = local_4b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"");
      iVar5 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args,local_4c8);
      if (local_4c8[0] == local_4b8) {
        return (UntypedActionResultHolderBase *)CONCAT44(extraout_var_03,iVar5);
      }
      operator_delete(local_4c8[0]);
      return (UntypedActionResultHolderBase *)CONCAT44(extraout_var_03,iVar5);
    }
  }
  else if (reaction == kAllow) {
    severity = kInfo;
    goto LAB_00154f70;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_4c8);
  (*this->_vptr_UntypedFunctionMockerBase[5])(this,untyped_args,local_4b8);
  std::__cxx11::stringbuf::str();
  iVar5 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args,local_340);
  pUVar8 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_02,iVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340[0]._M_dataplus._M_p != &local_340[0].field_2) {
    operator_delete(local_340[0]._M_dataplus._M_p);
  }
  if (pUVar8 != (UntypedActionResultHolderBase *)0x0) {
    (*pUVar8->_vptr_UntypedActionResultHolderBase[2])(pUVar8,local_4b8);
  }
  std::__cxx11::stringbuf::str();
  ReportUninterestingCall(reaction,local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340[0]._M_dataplus._M_p != &local_340[0].field_2) {
    operator_delete(local_340[0]._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8);
LAB_001551a1:
  std::ios_base::~ios_base(local_448);
  return pUVar8;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True iff we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when he wants informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
        // If the user wants this to be a warning, we print it only
        // when he wants to see warnings.
        reaction == kWarn ? LogIsVisible(kWarning) :
        // Otherwise, the user wants this to be an error, and we
        // should always print detailed information in the error.
        true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->UntypedPerformDefaultAction(untyped_args, "");
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(untyped_args, &ss);

    // Calculates the function result.
    const UntypedActionResultHolderBase* const result =
        this->UntypedPerformDefaultAction(untyped_args, ss.str());

    // Prints the function result.
    if (result != NULL)
      result->PrintAsActionResult(&ss);

    ReportUninterestingCall(reaction, ss.str());
    return result;
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = NULL;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.
  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(
          untyped_args, &untyped_action, &is_excessive,
          &ss, &why);
  const bool found = untyped_expectation != NULL;

  // True iff we need to print the call's arguments and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return
        untyped_action == NULL ?
        this->UntypedPerformDefaultAction(untyped_args, "") :
        this->UntypedPerformAction(untyped_action, untyped_args);
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(untyped_args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  const UntypedActionResultHolderBase* const result =
      untyped_action == NULL ?
      this->UntypedPerformDefaultAction(untyped_args, ss.str()) :
      this->UntypedPerformAction(untyped_action, untyped_args);
  if (result != NULL)
    result->PrintAsActionResult(&ss);
  ss << "\n" << why.str();

  if (!found) {
    // No expectation matches this call - reports a failure.
    Expect(false, NULL, -1, ss.str());
  } else if (is_excessive) {
    // We had an upper-bound violation and the failure message is in ss.
    Expect(false, untyped_expectation->file(),
           untyped_expectation->line(), ss.str());
  } else {
    // We had an expected call and the matching expectation is
    // described in ss.
    Log(kInfo, loc.str() + ss.str(), 2);
  }

  return result;
}